

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O0

int decode_truncation_inst
              (wasmbox_input_stream_t *ins,wasmbox_module_t *mod,wasmbox_mutable_function_t *func,
              wasm_u8_t op)

{
  wasm_u8_t wVar1;
  wasm_u8_t op1;
  wasm_u8_t op_local;
  wasmbox_mutable_function_t *func_local;
  wasmbox_module_t *mod_local;
  wasmbox_input_stream_t *ins_local;
  
  wVar1 = wasmbox_input_stream_read_u8(ins);
  switch(wVar1) {
  case '\0':
    fprintf(_stdout,"i32.trunc_sat_f32_s\n");
    ins_local._4_4_ = 0;
    break;
  case '\x01':
    fprintf(_stdout,"i32.trunc_sat_f32_u\n");
    ins_local._4_4_ = 0;
    break;
  case '\x02':
    fprintf(_stdout,"i32.trunc_sat_f64_s\n");
    ins_local._4_4_ = 0;
    break;
  case '\x03':
    fprintf(_stdout,"i32.trunc_sat_f64_u\n");
    ins_local._4_4_ = 0;
    break;
  case '\x04':
    fprintf(_stdout,"i64.trunc_sat_f32_s\n");
    ins_local._4_4_ = 0;
    break;
  case '\x05':
    fprintf(_stdout,"i64.trunc_sat_f32_u\n");
    ins_local._4_4_ = 0;
    break;
  case '\x06':
    fprintf(_stdout,"i64.trunc_sat_f64_s\n");
    ins_local._4_4_ = 0;
    break;
  case '\a':
    fprintf(_stdout,"i64.trunc_sat_f64_u\n");
    ins_local._4_4_ = 0;
    break;
  default:
    ins_local._4_4_ = -1;
  }
  return ins_local._4_4_;
}

Assistant:

static int decode_truncation_inst(wasmbox_input_stream_t *ins,
                                  wasmbox_module_t *mod,
                                  wasmbox_mutable_function_t *func,
                                  wasm_u8_t op) {
  wasm_u8_t op1 = wasmbox_input_stream_read_u8(ins);
  switch (op1) {
#define FUNC(opcode0, opcode1, type, inst, vmopcode) \
  case opcode1: {                                    \
    fprintf(stdout, "" #type "." #inst "\n");        \
    return 0;                                        \
  }
    SATURATING_TRUNCATION_INST_EACH(FUNC)
#undef FUNC
    default:
      return -1;
  }
  return -1;
}